

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O2

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::BinaryStandardOperatorWrapper,duckdb::BitwiseShiftLeftOperator,bool,false,false>
               (uhugeint_t *ldata,uhugeint_t *rdata,uhugeint_t *result_data,idx_t count,
               ValidityMask *mask,bool fun)

{
  unsigned_long *puVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  bool bVar10;
  uhugeint_t input;
  uhugeint_t input_00;
  uhugeint_t uVar11;
  uhugeint_t shift;
  uhugeint_t shift_00;
  uhugeint_t shift_01;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    lVar5 = 8;
    while (bVar10 = count != 0, count = count - 1, bVar10) {
      uVar11.upper = *(uint64_t *)((long)&ldata->lower + lVar5);
      uVar11.lower = *(uint64_t *)((long)ldata + lVar5 + -8);
      shift_01.upper = *(uint64_t *)((long)&rdata->lower + lVar5);
      shift_01.lower = *(uint64_t *)((long)rdata + lVar5 + -8);
      uVar11 = BitwiseShiftLeftOperator::
               Operation<duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::uhugeint_t>(uVar11,shift_01);
      *(uint64_t *)((long)result_data + lVar5 + -8) = uVar11.lower;
      *(uint64_t *)((long)&result_data->lower + lVar5) = uVar11.upper;
      lVar5 = lVar5 + 0x10;
    }
  }
  else {
    uVar4 = 0;
    for (uVar3 = 0; uVar3 != count + 0x3f >> 6; uVar3 = uVar3 + 1) {
      puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar7 = uVar4 + 0x40;
        if (count <= uVar4 + 0x40) {
          uVar7 = count;
        }
LAB_00d44e7a:
        uVar8 = uVar4 << 4 | 8;
        for (; uVar2 = uVar4, uVar4 < uVar7; uVar4 = uVar4 + 1) {
          input.upper = *(uint64_t *)((long)&ldata->lower + uVar8);
          input.lower = *(uint64_t *)((long)ldata + (uVar8 - 8));
          shift.upper = *(uint64_t *)((long)&rdata->lower + uVar8);
          shift.lower = *(uint64_t *)((long)rdata + (uVar8 - 8));
          uVar11 = BitwiseShiftLeftOperator::
                   Operation<duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::uhugeint_t>(input,shift);
          *(uint64_t *)((long)result_data + (uVar8 - 8)) = uVar11.lower;
          *(uint64_t *)((long)&result_data->lower + uVar8) = uVar11.upper;
          uVar8 = uVar8 + 0x10;
        }
      }
      else {
        uVar8 = puVar1[uVar3];
        uVar7 = uVar4 + 0x40;
        if (count <= uVar4 + 0x40) {
          uVar7 = count;
        }
        if (uVar8 == 0xffffffffffffffff) goto LAB_00d44e7a;
        uVar2 = uVar7;
        if (uVar8 != 0) {
          uVar6 = uVar4 << 4 | 8;
          for (uVar9 = 0; uVar2 = uVar4 + uVar9, uVar4 + uVar9 < uVar7; uVar9 = uVar9 + 1) {
            if ((uVar8 >> (uVar9 & 0x3f) & 1) != 0) {
              input_00.upper = *(uint64_t *)((long)&ldata->lower + uVar6);
              input_00.lower = *(uint64_t *)((long)ldata + (uVar6 - 8));
              shift_00.upper = *(uint64_t *)((long)&rdata->lower + uVar6);
              shift_00.lower = *(uint64_t *)((long)rdata + (uVar6 - 8));
              uVar11 = BitwiseShiftLeftOperator::
                       Operation<duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::uhugeint_t>
                                 (input_00,shift_00);
              *(uint64_t *)((long)result_data + (uVar6 - 8)) = uVar11.lower;
              *(uint64_t *)((long)&result_data->lower + uVar6) = uVar11.upper;
            }
            uVar6 = uVar6 + 0x10;
          }
        }
      }
      uVar4 = uVar2;
    }
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}